

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::BinaryLogLoss::forward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  Tensor *pTVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Tensor x;
  Tensor y;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  float *pfStack_a0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  float *pfStack_50;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_c8 = *(undefined8 *)(pTVar1->d).d;
  uStack_c0 = *(undefined8 *)((pTVar1->d).d + 2);
  local_b8 = *(undefined8 *)((pTVar1->d).d + 4);
  uStack_b0 = *(ulong *)((pTVar1->d).d + 6);
  local_a8 = *(undefined8 *)&(pTVar1->d).bd;
  pfStack_a0 = pTVar1->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_98,&pTVar1->bs);
  pTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start[1];
  local_78 = *(undefined8 *)(pTVar1->d).d;
  uStack_70 = *(undefined8 *)((pTVar1->d).d + 2);
  local_68 = *(undefined8 *)((pTVar1->d).d + 4);
  uStack_60 = *(undefined8 *)((pTVar1->d).d + 6);
  local_58 = *(undefined8 *)&(pTVar1->d).bd;
  pfStack_50 = pTVar1->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_48,&pTVar1->bs);
  iVar3 = 1;
  if (uStack_b0 >> 0x20 != 0) {
    uVar2 = 0;
    do {
      iVar3 = iVar3 * *(int *)((long)&local_c8 + uVar2 * 4);
      uVar2 = uVar2 + 1;
    } while (uStack_b0 >> 0x20 != uVar2);
  }
  uVar4 = iVar3 * (int)local_a8;
  if (uVar4 == 0) {
    fVar7 = 0.0;
  }
  else {
    uVar2 = 0;
    fVar7 = 0.0;
    do {
      fVar6 = pfStack_a0[uVar2];
      fVar9 = pfStack_50[uVar2];
      if ((fVar9 != 1.0) || (NAN(fVar9))) {
        if ((fVar9 == 0.0) && (!NAN(fVar9))) {
          fVar9 = fVar9 + -1.0;
          fVar6 = log1pf((float)(~-(uint)(fVar6 == 1.0) & (uint)-fVar6 |
                                -(uint)(fVar6 == 1.0) & 0x80800000));
          goto LAB_001a9ed2;
        }
        fVar6 = (float)(~-(uint)(fVar6 == 0.0) & (uint)fVar6 | -(uint)(fVar6 == 0.0) & 0x800000);
        uVar5 = -(uint)(fVar6 == 1.0);
        fVar6 = (float)(uVar5 & 0x800000 | ~uVar5 & (uint)fVar6);
        fVar8 = logf(fVar6);
        fVar6 = log1pf(-fVar6);
        fVar6 = -(fVar8 * fVar9 + fVar6 * (1.0 - fVar9));
      }
      else {
        fVar9 = -fVar9;
        fVar6 = logf((float)(~-(uint)(fVar6 == 0.0) & (uint)fVar6 | -(uint)(fVar6 == 0.0) & 0x800000
                            ));
LAB_001a9ed2:
        fVar6 = fVar6 * fVar9;
      }
      fVar7 = fVar7 + fVar6;
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  *fx->v = fVar7;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98);
  return;
}

Assistant:

void BinaryLogLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  auto x = *xs[0];
  auto y = *xs[1];
  FBinaryLogLoss bll;
  const size_t s = x.d.size();
  float dist = 0;
  for (size_t i = 0; i < s; ++i)
    dist += bll(x.v[i], y.v[i]);
  fx.v[0] = dist;
#endif
}